

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

Graph<int> * __thiscall hdc::Graph<int>::to_dot_abi_cxx11_(Graph<int> *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  reference piVar4;
  size_type sVar5;
  ostream *poVar6;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_RSI;
  _Self local_2b8;
  _Base_ptr local_2b0;
  _Self local_2a8;
  _Base_ptr local_2a0;
  _Self local_298;
  _Base_ptr local_290;
  _Rb_tree_const_iterator<int> local_288;
  iterator it2;
  iterator it;
  char *cc [12];
  undefined1 local_210 [8];
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  undefined1 local_1d0 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> colors;
  stringstream ss;
  ostream local_190 [384];
  Graph<int> *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&colors._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_1d0
             ,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              (in_RSI + 2));
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_210);
  std::operator<<(local_190,"graph G {\n");
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
  _Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *)&it2);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_288);
  local_290 = (_Base_ptr)
              std::
              map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::begin(in_RSI);
  it2._M_node = local_290;
  while( true ) {
    local_298._M_node =
         (_Base_ptr)
         std::
         map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::end(in_RSI);
    bVar1 = std::operator!=((_Self *)&it2,&local_298);
    if (!bVar1) break;
    poVar6 = std::operator<<(local_190,"    ");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           *)&it2);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar3->first);
    poVar6 = std::operator<<(poVar6," [color=");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           *)&it2);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_1d0,&ppVar3->first);
    poVar6 = std::operator<<(poVar6,cc[(long)*pmVar2 + -1]);
    std::operator<<(poVar6,"];\n");
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)&it2);
  }
  local_2a0 = (_Base_ptr)
              std::
              map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::begin(in_RSI);
  it2._M_node = local_2a0;
  while( true ) {
    local_2a8._M_node =
         (_Base_ptr)
         std::
         map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::end(in_RSI);
    bVar1 = std::operator!=((_Self *)&it2,&local_2a8);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           *)&it2);
    local_2b0 = (_Base_ptr)
                std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&ppVar3->second);
    local_288._M_node = local_2b0;
    while( true ) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             *)&it2);
      local_2b8._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&ppVar3->second);
      bVar1 = std::operator!=(&local_288,&local_2b8);
      if (!bVar1) break;
      piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&local_288);
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_210,piVar4);
      if (sVar5 == 0) {
        poVar6 = std::operator<<(local_190,"    ");
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                               *)&it2);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar3->first);
        poVar6 = std::operator<<(poVar6," -- ");
        piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&local_288);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar4);
        std::operator<<(poVar6,";\n");
      }
      std::_Rb_tree_const_iterator<int>::operator++(&local_288);
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           *)&it2);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_210,&ppVar3->first);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)&it2);
  }
  std::operator<<(local_190,"}\n");
  std::__cxx11::stringstream::str();
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_210);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_1d0
            );
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)&colors._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this;
}

Assistant:

std::string to_dot() {
            std::stringstream ss;
            std::map<T, int> colors = assignedColors;

            std::set<T> nodes;
            char const *cc[] = {
                "black",
                "red",
                "blue",
                "green",
                "yellow",
                "pink",
                "dimgray",
                "darkviolet",
                "gold2",
                "navyblue",
                "tomato",
                "coral4"
            };

            ss << "graph G {\n";

            typename std::map<T, std::set<T> >::iterator it;
            typename std::set<T>::iterator it2;

            for (it = graph.begin(); it != graph.end(); ++it) {
                ss << "    " << it->first << " [color=" << cc[colors[it->first]] << "];\n";
            }

            for (it = graph.begin(); it != graph.end(); ++it) {
                for (it2 = it->second.begin(); it2 != it->second.end(); ++it2) {
                    if (nodes.count(*it2) == 0) {
                        ss << "    " << it->first << " -- " << *it2 << ";\n";
                    }
                }

                nodes.insert(it->first);
            }

            ss << "}\n";
            return ss.str();
        }